

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydatapointer.h
# Opt level: O1

void __thiscall
QArrayDataPointer<QModelIndex>::reallocateAndGrow
          (QArrayDataPointer<QModelIndex> *this,GrowthPosition where,qsizetype n,
          QArrayDataPointer<QModelIndex> *old)

{
  QModelIndex *pQVar1;
  QArrayData *pQVar2;
  QModelIndex *pQVar3;
  bool bVar4;
  quintptr qVar5;
  int iVar6;
  QModelIndex *pQVar7;
  qsizetype qVar8;
  long lVar9;
  long in_FS_OFFSET;
  undefined1 auVar10 [16];
  QArrayDataPointer<QModelIndex> local_38;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  if (old == (QArrayDataPointer<QModelIndex> *)0x0 && where == GrowsAtEnd) {
    pQVar2 = &this->d->super_QArrayData;
    if (pQVar2 == (QArrayData *)0x0) {
      bVar4 = true;
    }
    else {
      bVar4 = 1 < (pQVar2->ref_)._q_value.super___atomic_base<int>._M_i;
    }
    if ((0 < n) && (!bVar4)) {
      if (pQVar2 == (QArrayData *)0x0) {
        qVar8 = 0;
        lVar9 = 0;
      }
      else {
        qVar8 = pQVar2->alloc;
        lVar9 = (this->size - pQVar2->alloc) +
                ((long)((long)this->ptr -
                       ((ulong)((long)&pQVar2[1].alloc + 7U) & 0xfffffffffffffff0)) >> 3) *
                -0x5555555555555555;
      }
      auVar10 = QArrayData::reallocateUnaligned(pQVar2,this->ptr,0x18,qVar8 + n + lVar9,Grow);
      this->d = (Data *)auVar10._0_8_;
      this->ptr = (QModelIndex *)auVar10._8_8_;
      goto LAB_0055b396;
    }
  }
  local_38.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_38.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_38.ptr = (QModelIndex *)&DAT_aaaaaaaaaaaaaaaa;
  allocateGrow(&local_38,this,n,where);
  if (this->size != 0) {
    lVar9 = this->size + (n >> 0x3f & n);
    if (this->d == (Data *)0x0) {
      bVar4 = true;
    }
    else {
      bVar4 = 1 < (this->d->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i;
    }
    pQVar7 = this->ptr;
    pQVar3 = pQVar7 + lVar9;
    if ((old != (QArrayDataPointer<QModelIndex> *)0x0) || (bVar4)) {
      if ((lVar9 != 0) && (0 < lVar9)) {
        do {
          local_38.ptr[local_38.size].m.ptr = (pQVar7->m).ptr;
          iVar6 = pQVar7->c;
          qVar5 = pQVar7->i;
          pQVar1 = local_38.ptr + local_38.size;
          pQVar1->r = pQVar7->r;
          pQVar1->c = iVar6;
          pQVar1->i = qVar5;
          pQVar7 = pQVar7 + 1;
          local_38.size = local_38.size + 1;
        } while (pQVar7 < pQVar3);
      }
    }
    else if ((lVar9 != 0) && (0 < lVar9)) {
      do {
        local_38.ptr[local_38.size].m.ptr = (pQVar7->m).ptr;
        iVar6 = pQVar7->c;
        qVar5 = pQVar7->i;
        pQVar1 = local_38.ptr + local_38.size;
        pQVar1->r = pQVar7->r;
        pQVar1->c = iVar6;
        pQVar1->i = qVar5;
        pQVar7 = pQVar7 + 1;
        local_38.size = local_38.size + 1;
      } while (pQVar7 < pQVar3);
    }
  }
  pQVar2 = &this->d->super_QArrayData;
  pQVar3 = this->ptr;
  *(undefined4 *)&this->d = local_38.d._0_4_;
  *(undefined4 *)((long)&this->d + 4) = local_38.d._4_4_;
  *(undefined4 *)&this->ptr = local_38.ptr._0_4_;
  *(undefined4 *)((long)&this->ptr + 4) = local_38.ptr._4_4_;
  qVar8 = this->size;
  this->size = local_38.size;
  local_38.d = (Data *)pQVar2;
  local_38.ptr = pQVar3;
  local_38.size = qVar8;
  if (old != (QArrayDataPointer<QModelIndex> *)0x0) {
    local_38.d = old->d;
    local_38.ptr = old->ptr;
    old->d = (Data *)pQVar2;
    old->ptr = pQVar3;
    local_38.size = old->size;
    old->size = qVar8;
  }
  if (&(local_38.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_38.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_38.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_38.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_38.d)->super_QArrayData,0x18,0x10);
    }
  }
LAB_0055b396:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

Q_NEVER_INLINE void reallocateAndGrow(QArrayData::GrowthPosition where, qsizetype n,
                                          QArrayDataPointer *old = nullptr)
    {
        if constexpr (QTypeInfo<T>::isRelocatable && alignof(T) <= alignof(std::max_align_t)) {
            if (where == QArrayData::GrowsAtEnd && !old && !needsDetach() && n > 0) {
                (*this)->reallocate(constAllocatedCapacity() - freeSpaceAtEnd() + n, QArrayData::Grow); // fast path
                return;
            }
        }

        QArrayDataPointer dp(allocateGrow(*this, n, where));
        if (n > 0)
            Q_CHECK_PTR(dp.data());
        if (where == QArrayData::GrowsAtBeginning) {
            Q_ASSERT(dp.freeSpaceAtBegin() >= n);
        } else {
            Q_ASSERT(dp.freeSpaceAtEnd() >= n);
        }
        if (size) {
            qsizetype toCopy = size;
            if (n < 0)
                toCopy += n;
            if (needsDetach() || old)
                dp->copyAppend(begin(), begin() + toCopy);
            else
                dp->moveAppend(begin(), begin() + toCopy);
            Q_ASSERT(dp.size == toCopy);
        }

        swap(dp);
        if (old)
            old->swap(dp);
    }